

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZChunkInTranslation.cpp
# Opt level: O2

void __thiscall
TPZChunkInTranslation::TPZChunkInTranslation
          (TPZChunkInTranslation *this,int64_t *objId,int *classId,TPZContBufferedStream *oldStream,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
          *versionInfo)

{
  _Rb_tree_header *p_Var1;
  
  this->_vptr_TPZChunkInTranslation = (_func_int **)&PTR__TPZChunkInTranslation_01651490;
  TPZContBufferedStream::TPZContBufferedStream(&this->mOldStream,oldStream);
  TPZContBufferedStream::TPZContBufferedStream(&this->mNewStream);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  ::_Rb_tree(&(this->mOldVersion)._M_t,&versionInfo->_M_t);
  (this->mNewVersion)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->mNewVersion)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  p_Var1 = &(this->mNewVersion)._M_t._M_impl.super__Rb_tree_header;
  (this->mNewVersion)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->mNewVersion)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->mNewVersion)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->mObjId = *objId;
  this->mClassId = *classId;
  TPZStack<long,_2>::TPZStack(&this->mNewObjIds);
  return;
}

Assistant:

TPZChunkInTranslation::TPZChunkInTranslation(const int64_t &objId, const int &classId, const TPZContBufferedStream &oldStream, const std::map<std::string, uint64_t> &versionInfo) :
mOldStream(oldStream),
mObjId(objId),
mClassId(classId),
mOldVersion(versionInfo) {
}